

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

void __thiscall
booster::locale::util::gregorian_calendar::set_timezone(gregorian_calendar *this,string *tz)

{
  int iVar1;
  ulong uVar2;
  string *in_RSI;
  long in_RDI;
  string *in_stack_00000048;
  time_t in_stack_00000088;
  gregorian_calendar *in_stack_00000090;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x89) = 0;
    iVar1 = parse_tz(in_stack_00000048);
    *(int *)(in_RDI + 0x8c) = iVar1;
  }
  else {
    *(undefined1 *)(in_RDI + 0x89) = 1;
    *(undefined4 *)(in_RDI + 0x8c) = 0;
  }
  from_time(in_stack_00000090,in_stack_00000088);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x90),in_RSI);
  return;
}

Assistant:

virtual void set_timezone(std::string const &tz)
            {
                if(tz.empty()) {
                    is_local_ = true;
                    tzoff_ = 0;
                }
                else {
                    is_local_ = false;
                    tzoff_ = parse_tz(tz);
                }
                from_time(time_);
                time_zone_name_ = tz;
            }